

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a9d::DataTransform<unsigned_int,_long>::DataTransform
          (DataTransform<unsigned_int,_long> *this,string *print_format,int num_column,
          NumericType input_numeric_type,WarningType warning_type,bool rounding,bool is_ascii_input,
          bool is_ascii_output,long minimum_value,long maximum_value)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  DataTransformInterface *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  byte in_stack_00000008;
  byte in_stack_00000010;
  _func_int **in_stack_00000018;
  _func_int **in_stack_00000020;
  
  DataTransformInterface::DataTransformInterface(in_RDI);
  in_RDI->_vptr_DataTransformInterface = (_func_int **)&PTR__DataTransform_001addb0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined4 *)&in_RDI[5]._vptr_DataTransformInterface = in_EDX;
  *(undefined4 *)((long)&in_RDI[5]._vptr_DataTransformInterface + 4) = in_ECX;
  *(undefined4 *)&in_RDI[6]._vptr_DataTransformInterface = in_R8D;
  *(byte *)((long)&in_RDI[6]._vptr_DataTransformInterface + 4) = in_R9B & 1;
  *(byte *)((long)&in_RDI[6]._vptr_DataTransformInterface + 5) = in_stack_00000008 & 1;
  *(byte *)((long)&in_RDI[6]._vptr_DataTransformInterface + 6) = in_stack_00000010 & 1;
  in_RDI[7]._vptr_DataTransformInterface = in_stack_00000018;
  in_RDI[8]._vptr_DataTransformInterface = in_stack_00000020;
  return;
}

Assistant:

DataTransform(const std::string& print_format, int num_column,
                NumericType input_numeric_type, WarningType warning_type,
                bool rounding, bool is_ascii_input, bool is_ascii_output,
                T2 minimum_value = static_cast<T2>(0),
                T2 maximum_value = static_cast<T2>(0))
      : print_format_(print_format),
        num_column_(num_column),
        input_numeric_type_(input_numeric_type),
        warning_type_(warning_type),
        rounding_(rounding),
        is_ascii_input_(is_ascii_input),
        is_ascii_output_(is_ascii_output),
        minimum_value_(minimum_value),
        maximum_value_(maximum_value) {
  }